

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCylinderShape.h
# Opt level: O2

cbtScalar __thiscall cbtCylinderShapeZ::getRadius(cbtCylinderShapeZ *this)

{
  cbtVector3 cVar1;
  
  cVar1 = cbtCylinderShape::getHalfExtentsWithMargin(&this->super_cbtCylinderShape);
  return cVar1.m_floats[0];
}

Assistant:

virtual cbtScalar getRadius() const
	{
		return getHalfExtentsWithMargin().getX();
	}